

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O3

void __thiscall Centaurus::ATNNode<unsigned_char>::ATNNode(ATNNode<unsigned_char> *this)

{
  this->_vptr_ATNNode = (_func_int **)&PTR__ATNNode_001c57f0;
  (this->m_transitions).
  super__Vector_base<Centaurus::ATNTransition<unsigned_char>,_std::allocator<Centaurus::ATNTransition<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_transitions).
  super__Vector_base<Centaurus::ATNTransition<unsigned_char>,_std::allocator<Centaurus::ATNTransition<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->m_transitions).
           super__Vector_base<Centaurus::ATNTransition<unsigned_char>,_std::allocator<Centaurus::ATNTransition<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_transitions).
           super__Vector_base<Centaurus::ATNTransition<unsigned_char>,_std::allocator<Centaurus::ATNTransition<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->m_invoke)._vptr_Identifier = (_func_int **)&PTR__Identifier_001c4d18;
  (this->m_invoke).m_id._M_dataplus._M_p = (pointer)&(this->m_invoke).m_id.field_2;
  (this->m_invoke).m_id._M_string_length = 0;
  (this->m_invoke).m_id.field_2._M_local_buf[0] = L'\0';
  NFA<unsigned_char>::NFA(&this->m_nfa);
  (this->m_literal)._M_dataplus._M_p = (pointer)&(this->m_literal).field_2;
  (this->m_literal)._M_string_length = 0;
  (this->m_literal).field_2._M_local_buf[0] = '\0';
  this->m_localid = -1;
  return;
}

Assistant:

ATNNode()
        : m_type(ATNNodeType::Blank), m_localid(-1)
    {
    }